

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConfigParser.cpp
# Opt level: O0

void __thiscall ConfigParser::ProcessConfiguration(ConfigParser *this,HANDLE hmod)

{
  bool bVar1;
  bool bVar2;
  char16 *pcVar3;
  char16 *openMode;
  ArenaAllocator *pAVar4;
  MemoryLogger *logger;
  StackTraceHelper *helper;
  WCHAR local_228 [3];
  bool all;
  char16 modulename [260];
  bool hasOutput;
  HANDLE hmod_local;
  ConfigParser *this_local;
  
  modulename[0x103]._1_1_ = 0;
  GetModuleFileNameW(hmod,local_228,0x104);
  bVar1 = Js::ConfigFlagsTable::IsEnabled
                    ((ConfigFlagsTable *)&Js::Configuration::Global,OutputFileFlag);
  if ((bVar1) &&
     (pcVar3 = Js::String::operator_cast_to_char16_t_((String *)&DAT_01eb89d0),
     pcVar3 != (char16 *)0x0)) {
    pcVar3 = Js::String::operator_cast_to_char16_t_((String *)&DAT_01eb89d0);
    openMode = Js::String::operator_cast_to_char16_t_((String *)&DAT_01eb89d8);
    SetOutputFile(this,pcVar3,openMode);
    modulename[0x103]._1_1_ = 1;
  }
  if ((DAT_01ea1248 & 1) != 0) {
    Output::UseDebuggerWindow();
    modulename[0x103]._1_1_ = 1;
  }
  if ((DAT_01eb89e0 & 1) != 0) {
    pAVar4 = GetOutputAllocator1();
    logger = Js::MemoryLogger::Create(pAVar4,_DAT_01eb89e4 * 3);
    Output::SetInMemoryLogger(&logger->super_ILogger);
    modulename[0x103]._1_1_ = 1;
  }
  if ((DAT_01eb89e8 & 1) != 0) {
    pAVar4 = GetOutputAllocator2();
    helper = Js::StackTraceHelper::Create(pAVar4);
    Output::SetStackTraceHelper(&helper->super_IStackTraceHelper);
  }
  if ((modulename[0x103]._1_1_ & 1) != 0) {
    ConfigParserAPI::DisplayInitialOutput(local_228);
    Output::Print(L"\n");
    Js::ConfigFlagsTable::VerboseDump((ConfigFlagsTable *)&Js::Configuration::Global);
    Output::Flush();
  }
  if ((DAT_01ea9f0b & 1) != 0) {
    DAT_01ea9f30 = 1;
    DAT_01ea4140 = 1;
  }
  Memory::ForcedMemoryConstraint::Apply();
  bVar1 = Js::Phases::IsEnabled((Phases *)&DAT_01eace60,AllPhase);
  if ((bVar1) || (bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01eace60,RecyclerPhase), bVar2)) {
    Memory::RecyclerMemoryTracking::Activate();
  }
  if ((bVar1) || (bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01eace60,PageAllocatorPhase), bVar2))
  {
    Memory::PageTracking::Activate();
  }
  if ((bVar1) || (bVar1 = Js::Phases::IsEnabled((Phases *)&DAT_01eace60,ArenaPhase), bVar1)) {
    Memory::ArenaMemoryTracking::Activate();
  }
  return;
}

Assistant:

void ConfigParser::ProcessConfiguration(HANDLE hmod)
{
#if defined(ENABLE_DEBUG_CONFIG_OPTIONS)
    bool hasOutput = false;
    char16 modulename[_MAX_PATH];

    GetModuleFileName((HMODULE)hmod, modulename, _MAX_PATH);

    // Win32 specific console creation code
    // xplat-todo: Consider having this mechanism available on other
    // platforms
    // Not a pressing need since ChakraCore runs only in consoles by
    // default so we don't need to allocate a second console for this
#if CONFIG_CONSOLE_AVAILABLE
    if (Js::Configuration::Global.flags.Console)
    {
        int fd;
        FILE *fp;

        // fail usually means there is an existing console. We don't really care.
        if (AllocConsole())
        {
            fd = _open_osfhandle((intptr_t)GetStdHandle(STD_OUTPUT_HANDLE), O_TEXT);
            fp = _wfdopen(fd, _u("w"));

            if (fp != nullptr)
            {
                *stdout = *fp;                
                setvbuf(stdout, nullptr, _IONBF, 0);

                fd = _open_osfhandle((intptr_t)GetStdHandle(STD_ERROR_HANDLE), O_TEXT);
                fp = _wfdopen(fd, _u("w"));

                if (fp != nullptr)
                {
                    *stderr = *fp;
                    setvbuf(stderr, nullptr, _IONBF, 0);

                    char16 buffer[_MAX_PATH + 70];

                    if (ConfigParserAPI::FillConsoleTitle(buffer, _MAX_PATH + 20, modulename))
                    {
                        SetConsoleTitle(buffer);
                    }

                    hasOutput = true;
                }
            }
        }
    }
#endif

    if (Js::Configuration::Global.flags.IsEnabled(Js::OutputFileFlag)
        && Js::Configuration::Global.flags.OutputFile != nullptr)
    {
        SetOutputFile(Js::Configuration::Global.flags.OutputFile, Js::Configuration::Global.flags.OutputFileOpenMode);
        hasOutput = true;
    }

    if (Js::Configuration::Global.flags.DebugWindow)
    {
        Output::UseDebuggerWindow();
        hasOutput = true;
    }

#ifdef ENABLE_TRACE
    if (CONFIG_FLAG(InMemoryTrace))
    {
        Output::SetInMemoryLogger(
            Js::MemoryLogger::Create(::GetOutputAllocator1(),
            CONFIG_FLAG(InMemoryTraceBufferSize) * 3));   // With stack each trace is 3 entries (header, msg, stack).
        hasOutput = true;
    }

#ifdef STACK_BACK_TRACE
    if (CONFIG_FLAG(TraceWithStack))
    {
        Output::SetStackTraceHelper(Js::StackTraceHelper::Create(::GetOutputAllocator2()));
    }
#endif // STACK_BACK_TRACE
#endif // ENABLE_TRACE

    if (hasOutput)
    {
        ConfigParserAPI::DisplayInitialOutput(modulename);

        Output::Print(_u("\n"));

        Js::Configuration::Global.flags.VerboseDump();
        Output::Flush();
    }

    if (Js::Configuration::Global.flags.ForceSerialized)
    {
        // Can't generate or execute byte code under forced serialize
        Js::Configuration::Global.flags.GenerateByteCodeBufferReturnsCantGenerate = true;
        Js::Configuration::Global.flags.ExecuteByteCodeBufferReturnsInvalidByteCode = true;
    }

    ForcedMemoryConstraint::Apply();
#endif

#ifdef MEMSPECT_TRACKING
    bool all = false;
    if (Js::Configuration::Global.flags.Memspect.IsEnabled(Js::AllPhase))
    {
        all = true;
    }
    if (all || Js::Configuration::Global.flags.Memspect.IsEnabled(Js::RecyclerPhase))
    {
        RecyclerMemoryTracking::Activate();
    }
    if (all || Js::Configuration::Global.flags.Memspect.IsEnabled(Js::PageAllocatorPhase))
    {
        PageTracking::Activate();
    }
    if (all || Js::Configuration::Global.flags.Memspect.IsEnabled(Js::ArenaPhase))
    {
        ArenaMemoryTracking::Activate();
    }
#endif
}